

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall QDialogButtonBoxPrivate::ensureFirstAcceptIsDefault(QDialogButtonBoxPrivate *this)

{
  QObject *pQVar1;
  bool bVar2;
  bool bVar3;
  QWidgetPrivate *this_00;
  QObject *pQVar4;
  QWidgetPrivate *this_01;
  const_iterator o;
  QPushButton **ppQVar5;
  QWidget *pQVar6;
  QDialogButtonBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QPushButton *pushButton;
  QList<QPushButton_*> *__range1;
  QWidget *parent;
  QWidget *p;
  QWidget *dialog;
  bool hasDefault;
  QPushButton *firstAcceptButton;
  QList<QAbstractButton_*> *acceptRoleList;
  QDialogButtonBox *q;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPushButton_*> pushButtons;
  qsizetype in_stack_ffffffffffffff48;
  QWidget *in_stack_ffffffffffffff50;
  byte enable;
  QObject *this_02;
  QWidgetPrivate *pQVar7;
  FocusPolicy policy;
  QWidgetPrivate *local_70;
  const_iterator local_30 [2];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetPrivate *)q_func(in_RDI);
  bVar2 = QList<QAbstractButton_*>::isEmpty((QList<QAbstractButton_*> *)0x66e521);
  if (bVar2) {
    pQVar4 = (QObject *)0x0;
  }
  else {
    QList<QAbstractButton_*>::at
              ((QList<QAbstractButton_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pQVar4 = (QObject *)qobject_cast<QPushButton*>((QObject *)0x66e546);
  }
  if (pQVar4 != (QObject *)0x0) {
    bVar2 = false;
    local_70 = (QWidgetPrivate *)0x0;
    this_02 = pQVar4;
    this_01 = this_00;
    do {
      enable = 0;
      if (this_01 != (QWidgetPrivate *)0x0) {
        bVar3 = QWidget::isWindow(in_stack_ffffffffffffff50);
        enable = bVar3 ^ 0xff;
      }
      if ((enable & 1) == 0) break;
      this_01 = (QWidgetPrivate *)QWidget::parentWidget((QWidget *)0x66e5ac);
      local_70 = (QWidgetPrivate *)qobject_cast<QDialog*>((QObject *)0x66e5bb);
    } while (local_70 == (QWidgetPrivate *)0x0);
    if (local_70 != (QWidgetPrivate *)0x0) {
      this_00 = local_70;
    }
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = this_00;
    QFlags<Qt::FindChildOption>::QFlags
              ((QFlags<Qt::FindChildOption> *)this_00,(FindChildOption)((ulong)this_00 >> 0x20));
    QObject::findChildren<QPushButton*>
              (this_02,(QFlagsStorageHelper<Qt::FindChildOption,_4>)SUB84((ulong)this_01 >> 0x20,0))
    ;
    pQVar6 = (QWidget *)&local_20;
    local_30[0].i = (QPushButton **)&DAT_aaaaaaaaaaaaaaaa;
    local_30[0] = QList<QPushButton_*>::begin((QList<QPushButton_*> *)this_00);
    o = QList<QPushButton_*>::end((QList<QPushButton_*> *)this_00);
    while( true ) {
      bVar3 = QList<QPushButton_*>::const_iterator::operator!=(local_30,o);
      policy = (FocusPolicy)((ulong)pQVar7 >> 0x20);
      if (!bVar3) break;
      ppQVar5 = QList<QPushButton_*>::const_iterator::operator*(local_30);
      pQVar1 = (QObject *)*ppQVar5;
      bVar3 = QPushButton::isDefault((QPushButton *)this_00);
      policy = (FocusPolicy)((ulong)pQVar7 >> 0x20);
      if ((bVar3) && (pQVar1 != pQVar4)) {
        bVar2 = true;
        break;
      }
      QList<QPushButton_*>::const_iterator::operator++(local_30);
    }
    if (((!bVar2) && (pQVar4 != (QObject *)0x0)) &&
       (QPushButton::setDefault((QPushButton *)this_02,(bool)enable),
       local_70 != (QWidgetPrivate *)0x0)) {
      QWidgetPrivate::get((QWidget *)0x66e74e);
      bVar2 = QWidgetPrivate::hasChildWithFocusPolicy(this_01,policy,pQVar6);
      if ((!bVar2) && (pQVar6 = QWidget::focusWidget((QWidget *)0x66e76e), pQVar6 == (QWidget *)0x0)
         ) {
        QWidget::setFocus((QWidget *)0x66e77e);
      }
    }
    QList<QPushButton_*>::~QList((QList<QPushButton_*> *)0x66e78d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogButtonBoxPrivate::ensureFirstAcceptIsDefault()
{
    Q_Q(QDialogButtonBox);
    const QList<QAbstractButton *> &acceptRoleList = buttonLists[QDialogButtonBox::AcceptRole];
    QPushButton *firstAcceptButton = acceptRoleList.isEmpty()
                                   ? nullptr
                                   : qobject_cast<QPushButton *>(acceptRoleList.at(0));

    if (!firstAcceptButton)
        return;

    bool hasDefault = false;
    QWidget *dialog = nullptr;
    QWidget *p = q;
    while (p && !p->isWindow()) {
        p = p->parentWidget();
        if ((dialog = qobject_cast<QDialog *>(p)))
            break;
    }

    QWidget *parent = dialog ? dialog : q;
    Q_ASSERT(parent);

    const auto pushButtons = parent->findChildren<QPushButton *>();
    for (QPushButton *pushButton : pushButtons) {
        if (pushButton->isDefault() && pushButton != firstAcceptButton) {
            hasDefault = true;
            break;
        }
    }
    if (!hasDefault && firstAcceptButton) {
        firstAcceptButton->setDefault(true);
        // When the QDialogButtonBox is focused, and it doesn't have an
        // explicit focus widget, it will transfer focus to its focus
        // proxy, which is the first button in the layout. This behavior,
        // combined with the behavior that QPushButtons in a QDialog will
        // by default have their autoDefault set to true, results in the
        // focus proxy/first button stealing the default button status
        // immediately when the button box is focused, which is not what
        // we want. Account for this by explicitly making the firstAcceptButton
        // focused as well, unless an explicit focus widget has been set, or
        // a dialog child has Qt::StrongFocus.
        if (dialog && !(QWidgetPrivate::get(dialog)->hasChildWithFocusPolicy(Qt::StrongFocus, q)
                        || dialog->focusWidget()))
            firstAcceptButton->setFocus();
    }
}